

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O0

_Bool tbl_MoveDeskToDesk(int sourceIdx,int targetIdx)

{
  Card_t card;
  Card_t card_00;
  _Bool _Var1;
  SolStack_t *stackPtr;
  int local_2bc;
  Card_t *pCStack_2b8;
  int srcCardIdx;
  Card_t *srcCardPtr;
  undefined4 uStack_2a8;
  Card_t helpCard;
  SolStack_t helpStack;
  SolStack_t *targetPtr;
  SolStack_t *srcStackPtr;
  int targetIdx_local;
  int sourceIdx_local;
  
  stackPtr = DeskStacks + sourceIdx;
  local_2bc = 0;
  while ((pCStack_2b8 = (Card_t *)0x0, (ulong)(long)local_2bc < stackPtr->m_size &&
         ((pCStack_2b8 = (Card_t *)((long)sourceIdx * 0x278 + 0x108b08 + (long)local_2bc * 0xc),
          pCStack_2b8->m_face != CF_UP ||
          (_Var1 = IsCardMovableToDesk(*pCStack_2b8,DeskStacks + targetIdx), !_Var1))))) {
    local_2bc = local_2bc + 1;
  }
  if (pCStack_2b8 == (Card_t *)0x0) {
    targetIdx_local._3_1_ = false;
  }
  else {
    stk_InitEmpty((SolStack_t *)&helpCard.m_color);
    while ((ulong)(long)local_2bc < stackPtr->m_size) {
      _Var1 = stk_Pop(stackPtr,(Card_t *)((long)&srcCardPtr + 4));
      if (_Var1) {
        card_00.m_face = helpCard.m_type;
        card_00.m_type = srcCardPtr._4_4_;
        card_00.m_color = uStack_2a8;
        stk_PushCopy((SolStack_t *)&helpCard.m_color,card_00);
      }
    }
    while (_Var1 = stk_Pop((SolStack_t *)&helpCard.m_color,(Card_t *)((long)&srcCardPtr + 4)), _Var1
          ) {
      card.m_face = helpCard.m_type;
      card.m_type = srcCardPtr._4_4_;
      card.m_color = uStack_2a8;
      stk_PushCopy(DeskStacks + targetIdx,card);
    }
    stk_TurnTopCardUp(stackPtr);
    targetIdx_local._3_1_ = true;
  }
  return targetIdx_local._3_1_;
}

Assistant:

bool tbl_MoveDeskToDesk(int sourceIdx, int targetIdx)
{
  SolStack_t* srcStackPtr = &DeskStacks[sourceIdx];
  SolStack_t* targetPtr = &DeskStacks[targetIdx];
  SolStack_t helpStack;
  Card_t helpCard;
  Card_t* srcCardPtr = NULL;
  int srcCardIdx;

  // try to find card facing up in the source column that would fit on target
  // card or empty slot
  for (srcCardIdx = 0; srcCardIdx < srcStackPtr->m_size; srcCardIdx++) {
    srcCardPtr = &srcStackPtr->m_cards[srcCardIdx];
    if (srcCardPtr->m_face == CF_UP &&
        IsCardMovableToDesk(*srcCardPtr, targetPtr)) {
      break; // got it
    }
    srcCardPtr = NULL;
  }

  if (!srcCardPtr) {
    return false;
  }

  // move cards from one stack to the other
  stk_InitEmpty(&helpStack);

  while (srcCardIdx < srcStackPtr->m_size) {
    if (stk_Pop(srcStackPtr, &helpCard)) {
      stk_PushCopy(&helpStack, helpCard);
    }
  }

  while (stk_Pop(&helpStack, &helpCard)) {
    stk_PushCopy(targetPtr, helpCard);
  }

  stk_TurnTopCardUp(srcStackPtr);

  return true;
}